

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamClient.cpp
# Opt level: O3

bool __thiscall
VViconCGStreamClient::ReadObjectEnums
          (VViconCGStreamClient *this,VCGStreamReaderWriter *i_rReaderWriter)

{
  uint uVar1;
  Enum EVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  byte unaff_BPL;
  VScopedReader Objects;
  VScopedReader Object;
  VScopedReader local_60;
  VScopedReader local_48;
  
  bVar3 = VCGStreamReaderWriter::Fill(i_rReaderWriter);
  if (bVar3) {
    ViconCGStreamIO::VScopedReader::VScopedReader(&local_60,&i_rReaderWriter->super_VBuffer);
    if (local_60.m_Enum == 0x1a2b0001) {
      do {
        uVar1 = ((local_60.m_rBuffer)->m_BufferImpl).m_Offset;
        bVar4 = 0;
        if ((uVar1 < local_60.m_Start) || (local_60.m_End <= uVar1)) break;
        ViconCGStreamIO::VScopedReader::VScopedReader(&local_48,&i_rReaderWriter->super_VBuffer);
        EVar2 = local_48.m_Enum;
        bVar4 = unaff_BPL;
        if (local_48.m_Enum == 0x186a1) {
          iVar5 = (*(this->m_ServerObjects).super_VItem._vptr_VItem[2])
                            (&this->m_ServerObjects,((local_48.m_rBuffer)->m_BufferImpl).m_rParent);
          if ((char)iVar5 == '\0') {
            bVar4 = 0;
          }
          else {
            this->m_bEnumsChanged = true;
            bVar4 = 1;
          }
        }
        if (local_48.m_Start < local_48.m_End) {
          ((local_48.m_rBuffer)->m_BufferImpl).m_Offset = local_48.m_End;
        }
        unaff_BPL = bVar4;
      } while (EVar2 != 0x186a1);
    }
    else {
      bVar4 = 0;
    }
    if (local_60.m_Start < local_60.m_End) {
      ((local_60.m_rBuffer)->m_BufferImpl).m_Offset = local_60.m_End;
    }
  }
  else {
    bVar4 = 0;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool VViconCGStreamClient::ReadObjectEnums( VCGStreamReaderWriter& i_rReaderWriter )
{
  if( !i_rReaderWriter.Fill() )
  {
    return false;
  }

  ViconCGStreamIO::VScopedReader Objects( i_rReaderWriter );
  if( Objects.Enum() != ViconCGStreamEnum::Objects )
  {
    return false;
  }

  while( Objects.Ok() )
  {
    ViconCGStreamIO::VScopedReader Object( i_rReaderWriter );

    if( Object.Enum() == ViconCGStreamEnum::ObjectEnums )
    {
      if( !Object.Read( m_ServerObjects ) )
      {
        return false;
      }

      m_bEnumsChanged = true;
      return true;
    }
  }

  return false;
}